

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall t_swift_generator::generate_service(t_swift_generator *this,t_service *tservice)

{
  t_service *tservice_local;
  t_swift_generator *this_local;
  
  generate_swift_service_protocol(this,(ostream *)&this->f_decl_,tservice);
  generate_swift_service_client(this,(ostream *)&this->f_decl_,tservice);
  if ((this->async_clients_ & 1U) != 0) {
    generate_swift_service_protocol_async(this,(ostream *)&this->f_decl_,tservice);
    generate_swift_service_client_async(this,(ostream *)&this->f_decl_,tservice);
  }
  generate_swift_service_server(this,(ostream *)&this->f_decl_,tservice);
  generate_swift_service_helpers(this,tservice);
  generate_swift_service_client_implementation(this,(ostream *)&this->f_impl_,tservice);
  if ((this->async_clients_ & 1U) != 0) {
    generate_swift_service_client_async_implementation(this,(ostream *)&this->f_impl_,tservice);
  }
  generate_swift_service_server_implementation(this,(ostream *)&this->f_impl_,tservice);
  return;
}

Assistant:

void t_swift_generator::generate_service(t_service* tservice) {

  generate_swift_service_protocol(f_decl_, tservice);
  generate_swift_service_client(f_decl_, tservice);
  if (async_clients_) {
    generate_swift_service_protocol_async(f_decl_, tservice);
    generate_swift_service_client_async(f_decl_, tservice);
  }
  generate_swift_service_server(f_decl_, tservice);

  generate_swift_service_helpers(tservice);

  generate_swift_service_client_implementation(f_impl_, tservice);
  if (async_clients_) {
    generate_swift_service_client_async_implementation(f_impl_, tservice);
  }
  generate_swift_service_server_implementation(f_impl_, tservice);
}